

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O2

void __thiscall cooper::timer::start(timer *this,nanoseconds *initTime,nanoseconds *interval)

{
  timer *local_38;
  thread local_30;
  code *local_28;
  undefined8 local_20;
  
  stop(this);
  *(rep *)(this + 0x88) = initTime->__r;
  *(rep *)(this + 0x90) = interval->__r;
  LOCK();
  this[0x98] = (timer)0x0;
  UNLOCK();
  local_28 = thread_func;
  local_20 = 0;
  local_38 = this;
  std::thread::thread<void(cooper::timer::*)(),cooper::timer*,void>
            (&local_30,(type *)&local_28,&local_38);
  std::thread::operator=((thread *)(this + 0x28),&local_30);
  std::thread::~thread(&local_30);
  return;
}

Assistant:

void timer::start(const nanoseconds& initTime,
				  const nanoseconds& interval)
{
	// Cancel a running timer
	stop();

	initTime_ = initTime;
	interval_ = interval;

	quit_ = false;
	thr_ = thread(&timer::thread_func, this);
}